

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool tinyusdz::inverse(matrix3d *_m,matrix3d *inv_m,double eps)

{
  long lVar1;
  matrix3d *pmVar2;
  byte bVar3;
  double dVar4;
  double dVar5;
  matrix3d local_60;
  
  bVar3 = 0;
  dVar4 = determinant(_m);
  dVar4 = ABS(dVar4);
  if (eps < dVar4) {
    dVar5 = dVar4;
    if (dVar4 <= 0.0) {
      dVar5 = 0.0;
    }
    if (dVar5 * eps < dVar4) {
      inverse(&local_60,_m);
      pmVar2 = &local_60;
      for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
        inv_m->m[0][0] = pmVar2->m[0][0];
        pmVar2 = (matrix3d *)((long)pmVar2 + ((ulong)bVar3 * -2 + 1) * 8);
        inv_m = (matrix3d *)((long)inv_m + ((ulong)bVar3 * -2 + 1) * 8);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool inverse(const value::matrix3d &_m, value::matrix3d &inv_m, double eps) {
  double det = determinant(_m);

  if (math::is_close(std::fabs(det), 0.0, eps)) {
    return false;
  }

  inv_m = inverse(_m);
  return true;
}